

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O0

Namer * __thiscall
LiteScript::Namer::Load
          (Namer *__return_storage_ptr__,Namer *this,istream *stream,Memory *memory,
          offset_in_Memory_to_subr caller)

{
  Memory *pMVar1;
  uint uVar2;
  long *plVar3;
  Memory *local_168;
  Memory *local_138;
  Memory *local_110;
  Nullable<LiteScript::Variable> local_e0;
  value_type local_c0;
  uint local_b0;
  uint local_ac;
  uint i;
  uint sz;
  Nullable<LiteScript::Variable> local_78;
  Variable local_58;
  undefined1 local_41;
  Memory *local_40;
  offset_in_Memory_to_subr caller_local;
  Memory *local_30;
  Memory *memory_local;
  istream *stream_local;
  offset_in_Memory_to_subr local_18;
  Namer *local_10;
  Namer *res;
  
  local_41 = 0;
  local_110 = memory;
  if (((ulong)memory & 1) != 0) {
    local_110 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)(stream + caller) + -1);
  }
  local_40 = memory;
  caller_local = caller;
  local_30 = (Memory *)stream;
  memory_local = (Memory *)this;
  stream_local = (istream *)memory;
  local_18 = caller;
  local_10 = __return_storage_ptr__;
  uVar2 = (*(code *)local_110)(stream + caller,this);
  Memory::GetVariable(&local_78,(Memory *)stream,uVar2);
  Nullable::operator_cast_to_Variable((Nullable *)&local_58);
  Namer(__return_storage_ptr__,&local_58);
  Variable::~Variable(&local_58);
  Nullable<LiteScript::Variable>::~Nullable(&local_78);
  pMVar1 = local_30;
  plVar3 = (long *)((long)(local_30->arr)._M_elems + caller_local);
  if (((ulong)local_40 & 1) == 0) {
    local_138 = local_40;
  }
  else {
    local_138 = *(Memory **)((long)(local_40->arr)._M_elems + *plVar3 + -1);
  }
  uVar2 = (*(code *)local_138)(plVar3,memory_local);
  Memory::GetVariable((Nullable<LiteScript::Variable> *)&i,pMVar1,uVar2);
  Nullable<LiteScript::Variable>::operator=
            (&__return_storage_ptr__->current,(Nullable<LiteScript::Variable> *)&i);
  Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&i);
  local_ac = IStreamer::Read<unsigned_int>((istream *)memory_local);
  for (local_b0 = 0; pMVar1 = local_30, local_b0 < local_ac; local_b0 = local_b0 + 1) {
    plVar3 = (long *)((long)(local_30->arr)._M_elems + caller_local);
    if (((ulong)local_40 & 1) == 0) {
      local_168 = local_40;
    }
    else {
      local_168 = *(Memory **)((long)(local_40->arr)._M_elems + *plVar3 + -1);
    }
    uVar2 = (*(code *)local_168)(plVar3,memory_local);
    Memory::GetVariable(&local_e0,pMVar1,uVar2);
    Nullable::operator_cast_to_Variable((Nullable *)&local_c0);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&__return_storage_ptr__->heap,&local_c0);
    Variable::~Variable(&local_c0);
    Nullable<LiteScript::Variable>::~Nullable(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Namer LiteScript::Namer::Load(std::istream &stream, Memory& memory, unsigned int (Memory::*caller)(std::istream&)) {
    Namer res(memory.GetVariable((memory.*caller)(stream)));
    res.current = memory.GetVariable((memory.*caller)(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        res.heap.push_back(memory.GetVariable((memory.*caller)(stream)));
    return res;
}